

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  uVar3 = (uint)*(byte *)&this->bits_;
  switch(*(byte *)&this->bits_) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::operator<<((ostream *)local_180,"LargestInt out of UInt range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    goto LAB_00128ba5;
  case 2:
    bVar2 = isUInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::operator<<((ostream *)local_180,"LargestUInt out of UInt range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
LAB_00128ba5:
    uVar3 = *(uint *)&this->value_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (4294967295.0 < dVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::operator<<((ostream *)local_180,"double out of UInt range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    uVar3 = (uint)(long)dVar1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"Value is not convertible to UInt.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    uVar3 = (uint)(this->value_).bool_;
  }
  return uVar3;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}